

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdevice.cpp
# Opt level: O3

QList<QMimeType> * __thiscall
QPrintDevice::supportedMimeTypes(QList<QMimeType> *__return_storage_ptr__,QPrintDevice *this)

{
  QPlatformPrintDevice *pQVar1;
  int iVar2;
  
  pQVar1 = (this->d).value.ptr;
  if ((pQVar1 != (QPlatformPrintDevice *)0x0) &&
     (iVar2 = (*pQVar1->_vptr_QPlatformPrintDevice[6])(), (char)iVar2 != '\0')) {
    (*((this->d).value.ptr)->_vptr_QPlatformPrintDevice[0x25])(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QMimeType *)0x0;
  (__return_storage_ptr__->d).size = 0;
  return __return_storage_ptr__;
}

Assistant:

QList<QMimeType> QPrintDevice::supportedMimeTypes() const
{
    return isValid() ? d->supportedMimeTypes() : QList<QMimeType>();
}